

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

int bitset_container_rank(bitset_container_t *container,uint16_t x)

{
  int iVar1;
  ushort in_SI;
  long in_RDI;
  uint64_t mask;
  uint64_t lastpos;
  uint64_t lastword;
  int end;
  int i;
  int sum;
  undefined4 local_14;
  undefined4 local_10;
  
  local_10 = 0;
  for (local_14 = 0; local_14 < (int)(in_SI / 0x40); local_14 = local_14 + 1) {
    iVar1 = roaring_hamming(*(uint64_t *)(*(long *)(in_RDI + 8) + (long)local_14 * 8));
    local_10 = iVar1 + local_10;
  }
  iVar1 = roaring_hamming(*(ulong *)(*(long *)(in_RDI + 8) + (long)local_14 * 8) &
                          (1L << (sbyte)((ulong)in_SI % 0x40)) * 2 - 1U);
  return iVar1 + local_10;
}

Assistant:

int bitset_container_rank(const bitset_container_t *container, uint16_t x) {
  // credit: aqrit
  int sum = 0;
  int i = 0;
  for (int end = x / 64; i < end; i++){
    sum += roaring_hamming(container->words[i]);
  }
  uint64_t lastword = container->words[i];
  uint64_t lastpos = UINT64_C(1) << (x % 64);
  uint64_t mask = lastpos + lastpos - 1; // smear right
  sum += roaring_hamming(lastword & mask);
  return sum;
}